

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formula.cpp
# Opt level: O3

Formula * Kernel::Formula::quantify(Formula *f)

{
  uint uVar1;
  Term *this;
  uint *puVar2;
  uint uVar3;
  bool bVar4;
  pointer pcVar5;
  pointer pcVar6;
  uint *puVar7;
  pointer pcVar8;
  Formula *pFVar9;
  Entry *e;
  uint *puVar10;
  uint *puVar11;
  void **head;
  uint *puVar12;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> tMap;
  uint *local_88;
  pointer local_80;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_58;
  
  local_58._timestamp = 1;
  local_58._size = 0;
  local_58._deleted = 0;
  local_58._capacityIndex = 0;
  local_58._capacity = 0;
  local_58._nextExpansionOccupancy = 0;
  local_58._entries._0_4_ = 0;
  local_58._entries._4_4_ = 0;
  local_58._afterLast._0_4_ = 0;
  local_58._afterLast._4_4_ = 0;
  SortHelper::collectVariableSorts(f,&local_58,true);
  uVar3 = local_58._timestamp;
  puVar10 = (uint *)CONCAT44(local_58._entries._4_4_,local_58._entries._0_4_);
  puVar2 = (uint *)CONCAT44(local_58._afterLast._4_4_,local_58._afterLast._0_4_);
  if (puVar10 != puVar2) {
    local_80 = (pointer)0x0;
    puVar12 = (uint *)0x0;
    puVar11 = (uint *)0x0;
    pcVar5 = (pointer)0x0;
    do {
      while ((*puVar10 & 1) == 0 && *puVar10 >> 2 == uVar3) {
        uVar1 = puVar10[1];
        this = *(Term **)(puVar10 + 2);
        if ((((ulong)this & 3) == 0) && (bVar4 = Term::isSuper(this), bVar4)) {
          local_88 = (uint *)Lib::FixedSizeAllocator<16UL>::alloc
                                       ((FixedSizeAllocator<16UL> *)
                                        (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          *local_88 = uVar1;
          *(uint **)(local_88 + 2) = puVar12;
          pcVar6 = (pointer)Lib::FixedSizeAllocator<16UL>::alloc
                                      ((FixedSizeAllocator<16UL> *)
                                       (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          puVar7 = local_88;
          if (puVar11 != (uint *)0x0) {
            puVar7 = puVar11;
          }
          *(Term **)pcVar6 = this;
          *(pointer *)(pcVar6 + 8) = local_80;
          pcVar8 = pcVar5;
          if (pcVar5 == (pointer)0x0) {
            pcVar8 = pcVar6;
          }
        }
        else {
          puVar7 = (uint *)Lib::FixedSizeAllocator<16UL>::alloc
                                     ((FixedSizeAllocator<16UL> *)
                                      (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          *puVar7 = uVar1;
          puVar7[2] = 0;
          puVar7[3] = 0;
          local_88 = puVar7;
          if (puVar11 != (uint *)0x0) {
            *(uint **)(puVar11 + 2) = puVar7;
            local_88 = puVar12;
          }
          pcVar8 = (pointer)Lib::FixedSizeAllocator<16UL>::alloc
                                      ((FixedSizeAllocator<16UL> *)
                                       (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
          *(Term **)pcVar8 = this;
          pcVar8[8] = '\0';
          pcVar8[9] = '\0';
          pcVar8[10] = '\0';
          pcVar8[0xb] = '\0';
          pcVar8[0xc] = '\0';
          pcVar8[0xd] = '\0';
          pcVar8[0xe] = '\0';
          pcVar8[0xf] = '\0';
          pcVar6 = pcVar8;
          if (pcVar5 != (pointer)0x0) {
            *(pointer *)(pcVar5 + 8) = pcVar8;
            pcVar6 = local_80;
          }
        }
        local_80 = pcVar6;
        puVar10 = puVar10 + 4;
        puVar12 = local_88;
        puVar11 = puVar7;
        pcVar5 = pcVar8;
        if (puVar10 == puVar2) goto LAB_0052266c;
      }
      puVar10 = puVar10 + 4;
      local_88 = puVar12;
    } while (puVar10 != puVar2);
LAB_0052266c:
    if (local_88 != (uint *)0x0) {
      pFVar9 = (Formula *)
               Lib::FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      pFVar9->_connective = FORALL;
      (pFVar9->_label)._M_dataplus._M_p = (pointer)&(pFVar9->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar9->_label,DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + DEFAULT_LABEL_abi_cxx11_);
      *(uint **)(pFVar9 + 1) = local_88;
      pFVar9[1]._label._M_dataplus._M_p = local_80;
      pFVar9[1]._label._M_string_length = (size_type)f;
      f = pFVar9;
    }
  }
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(&local_58)
  ;
  return f;
}

Assistant:

Formula* Formula::quantify(Formula* f)
{

  DHMap<unsigned,TermList> tMap;
  SortHelper::collectVariableSorts(f,tMap,/*ignoreBound=*/true);

  //we have to quantify the formula
  VList::FIFO quantifiedVars;
  SList::FIFO theirSorts;

  DHMap<unsigned,TermList>::Iterator tmit(tMap);
  while(tmit.hasNext()) {
    unsigned v;
    TermList s;
    tmit.next(v, s);
    if(s.isTerm() && s.term()->isSuper()){
      // type variable must appear at the start of the list
      quantifiedVars.pushFront(v);
      theirSorts.pushFront(s);
    } else {
      quantifiedVars.pushBack(v);
      theirSorts.pushBack(s);
    }
  }
  if(!quantifiedVars.empty()) {
    f = new QuantifiedFormula(FORALL, quantifiedVars.list(), theirSorts.list(), f);
  }
  return f;
}